

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::DebuggerScope::IsAncestorOf(DebuggerScope *this,DebuggerScope *potentialChildScope)

{
  bool bVar1;
  
  if (potentialChildScope == (DebuggerScope *)0x0) {
    return false;
  }
  do {
    bVar1 = potentialChildScope != (DebuggerScope *)0x0;
    if (potentialChildScope == (DebuggerScope *)0x0) {
      return bVar1;
    }
    potentialChildScope = (potentialChildScope->parentScope).ptr;
  } while (potentialChildScope != this);
  return bVar1;
}

Assistant:

bool DebuggerScope::IsAncestorOf(const DebuggerScope* potentialChildScope)
    {
        if (potentialChildScope == nullptr)
        {
            // If the child scope is null, it represents the global scope which
            // cannot be a child of anything.
            return false;
        }

        const DebuggerScope* currentScope = potentialChildScope;
        while (currentScope)
        {
            if (currentScope->GetParentScope() == this)
            {
                return true;
            }

            currentScope = currentScope->GetParentScope();
        }

        return false;
    }